

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O1

LPCSTR NpyArray::LoadNPZ(string *filename,npz_t *arrays)

{
  LPCSTR pcVar1;
  int iVar2;
  char *unaff_R14;
  FILE *fp;
  string varname;
  NpyArray arr;
  ScopeExitRun closeFp;
  FILE *local_d0;
  string local_c8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  NpyArray local_88;
  function<void_()> local_50;
  
  local_d0 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_d0 == (FILE *)0x0) {
    unaff_R14 = "error: unable to open file";
  }
  else {
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = &local_d0;
    pcStack_90 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:218:29)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:218:29)>
               ::_M_manager;
    std::function<void_()>::function(&local_50,(function<void_()> *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    do {
      local_88.numValues = 0;
      local_88.wordSize = 0;
      local_88.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.data = (uint8_t *)0x0;
      local_88.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.type = '\0';
      local_88.fortranOrder = false;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar1 = LoadArrayNPZ((FILE *)local_d0,&local_c8,&local_88);
      if (pcVar1 == (LPCSTR)0x0) {
        iVar2 = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NpyArray>,std::_Select1st<std::pair<std::__cxx11::string_const,NpyArray>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>
        ::_M_emplace_unique<std::__cxx11::string&,NpyArray>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NpyArray>,std::_Select1st<std::pair<std::__cxx11::string_const,NpyArray>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>
                    *)arrays,&local_c8,&local_88);
      }
      else {
        iVar2 = 3;
        if (pcVar1 != (LPCSTR)0x1) {
          iVar2 = 1;
          unaff_R14 = pcVar1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      ~NpyArray(&local_88);
    } while (iVar2 == 0);
    if (iVar2 == 3) {
      unaff_R14 = (LPCSTR)0x0;
    }
    TScopeExitRun<std::function<void_()>_>::~TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)&local_50);
  }
  return unaff_R14;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(std::string filename, npz_t& arrays)
{
	FILE* fp = fopen(filename.c_str(), "rb");
	if (!fp)
		return "error: unable to open file";
	const ScopeExitRun closeFp([&]() { fclose(fp); });
	while (true) {
		NpyArray arr;
		std::string varname;
		const LPCSTR ret = LoadArrayNPZ(fp, varname, arr);
		if (ret == (const char*)1)
			break;
		if (ret != NULL)
			return ret;
		arrays.emplace(varname, std::move(arr));
	}
	return NULL;
}